

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void set_params_rd_pick_inter_mode
               (AV1_COMP *cpi,MACROBLOCK *x,HandleInterModeArgs *args,BLOCK_SIZE bsize,
               mode_skip_mask_t *mode_skip_mask,int skip_ref_frame_mask,uint *ref_costs_single,
               uint (*ref_costs_comp) [8],buf_2d (*yv12_mb) [3])

{
  int16_t *piVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  BLOCK_SIZE in_CL;
  AV1_COMP *in_RDX;
  int16_t *unaff_RBX;
  int_mv (*in_RSI) [2];
  int_mv *in_RDI;
  mode_skip_mask_t *in_R8;
  uint in_R9D;
  int idx;
  int num_planes;
  int dst_height2 [3];
  int dst_height1 [3];
  int dst_width2 [3];
  int dst_width1 [3];
  int prune_obmc;
  int use_actual_frame_probs;
  FRAME_UPDATE_TYPE update_type;
  MV_REFERENCE_FRAME *rf;
  MV_REFERENCE_FRAME ref_frame_1;
  MV_REFERENCE_FRAME ref_frame;
  int mi_col;
  int mi_row;
  uchar segment_id;
  MB_MODE_INFO_EXT *mbmi_ext;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  MACROBLOCKD *in_stack_ffffffffffffff08;
  AV1_COMMON *in_stack_ffffffffffffff10;
  qm_val_t **in_stack_ffffffffffffff18;
  MACROBLOCK *in_stack_ffffffffffffff20;
  AV1_COMP *in_stack_ffffffffffffff28;
  int_mv local_d0;
  uint32_t in_stack_ffffffffffffff34;
  MODE_EVAL_TYPE mode_eval_type;
  MACROBLOCK *x_00;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 uVar6;
  undefined4 uVar7;
  buf_2d (*in_stack_ffffffffffffff60) [3];
  uint8_t **tmp_buf;
  BLOCK_SIZE bsize_00;
  undefined4 uVar8;
  undefined2 uVar9;
  BLOCK_SIZE in_stack_ffffffffffffff6e;
  undefined1 uVar10;
  MV_REFERENCE_FRAME in_stack_ffffffffffffff6f;
  undefined1 uVar11;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar12;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 uVar13;
  AV1_COMP *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  MV_REFERENCE_FRAME (*in_stack_ffffffffffffff90) [2];
  undefined2 in_stack_ffffffffffffff98;
  byte in_stack_ffffffffffffff9a;
  byte bVar14;
  int in_stack_ffffffffffffff9c;
  int iVar15;
  undefined4 in_stack_ffffffffffffffa0;
  undefined3 in_stack_ffffffffffffffa4;
  uint above_stride;
  MACROBLOCKD *xd_00;
  AV1_COMMON *cm_00;
  MACROBLOCK *x_01;
  int_mv *x_02;
  undefined4 in_stack_ffffffffffffffc8;
  AV1_COMP *ref_mv_weight;
  
  x_02 = in_RDI + 0xefe0;
  x_01 = (MACROBLOCK *)(in_RSI + 0x34);
  cm_00 = *(AV1_COMMON **)in_RSI[0x40b];
  xd_00 = (MACROBLOCKD *)(in_RSI + 0x78e);
  above_stride = CONCAT13((char)*(undefined2 *)((long)cm_00->buffer_removal_times + 0x53),
                          in_stack_ffffffffffffffa4) & 0x7ffffff;
  x_00 = (MACROBLOCK *)(in_RSI + 0x834);
  ref_mv_weight = in_RDX;
  iVar3 = is_cur_buf_hbd((MACROBLOCKD *)(in_RSI + 0x34));
  init_neighbor_pred_buf((OBMCBuffer *)x_00,(HandleInterModeArgs *)in_RDX,iVar3);
  av1_collect_neighbors_ref_counts((MACROBLOCKD *)in_stack_ffffffffffffff20);
  estimate_ref_frame_costs
            (cm_00,xd_00,(ModeCosts *)CONCAT44(above_stride,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff9c,(uint *)in_stack_ffffffffffffff90,
             (uint (*) [8])CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  iVar3 = *(int *)&x_01->plane[0].src_diff;
  iVar15 = *(int *)((long)&x_01->plane[0].src_diff + 4);
  in_RSI[0x2bb2][0].as_int = 0x7fffffff;
  in_RSI[0x2bb2][1].as_int = 0x7fffffff;
  bVar14 = 1;
  do {
    mode_eval_type = (MODE_EVAL_TYPE)(in_stack_ffffffffffffff34 >> 0x18);
    iVar4 = (int)in_stack_ffffffffffffff90;
    if ('\a' < (char)bVar14) {
      if (in_RDI[0x18332].as_int == 0) {
        iVar5 = is_comp_ref_allowed(in_CL);
        mode_eval_type = (MODE_EVAL_TYPE)(in_stack_ffffffffffffff34 >> 0x18);
        iVar4 = (int)in_stack_ffffffffffffff90;
        if (iVar5 != 0) {
          in_stack_ffffffffffffff9a = 8;
          while( true ) {
            mode_eval_type = (MODE_EVAL_TYPE)(in_stack_ffffffffffffff34 >> 0x18);
            iVar4 = (int)in_stack_ffffffffffffff90;
            if ('\x1c' < (char)in_stack_ffffffffffffff9a) break;
            *(undefined2 *)
             ((long)xd_00->plane[0].seg_iqmatrix[6] +
             (long)(char)in_stack_ffffffffffffff9a * 2 + 0x78) = 0;
            *(undefined1 *)
             ((long)xd_00->plane[0].seg_iqmatrix[6] + (long)(char)in_stack_ffffffffffffff9a + 0x38)
                 = 0xff;
            in_stack_ffffffffffffff90 = ref_frame_map + ((char)in_stack_ffffffffffffff9a + -8);
            if (((((in_RDI[0x1822e].as_int & (uint)""[(*in_stack_ffffffffffffff90)[0]]) != 0) &&
                 ((in_RDI[0x1822e].as_int &
                  (uint)""[ref_frame_map[(char)in_stack_ffffffffffffff9a + -8][1]]) != 0)) &&
                (((in_R9D & 1 << (in_stack_ffffffffffffff9a & 0x1f)) == 0 ||
                 (iVar4 = is_ref_frame_used_in_cache
                                    ((MV_REFERENCE_FRAME)((ulong)in_stack_ffffffffffffff10 >> 0x18),
                                     (MB_MODE_INFO *)in_stack_ffffffffffffff08), iVar4 != 0)))) &&
               (iVar4 = prune_ref_frame(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                        (MV_REFERENCE_FRAME)
                                        ((ulong)in_stack_ffffffffffffff18 >> 0x38)), iVar4 == 0)) {
              in_stack_ffffffffffffff08 = (MACROBLOCKD *)((x_01->e_mbd).ref_mv_stack[0x16] + 4);
              in_stack_ffffffffffffff18 = xd_00->plane[0].seg_iqmatrix[6] + 0xb;
              in_stack_ffffffffffffff20 = (MACROBLOCK *)(xd_00->plane[0].seg_iqmatrix[6] + 0xf);
              in_stack_ffffffffffffff10 = (AV1_COMMON *)0x0;
              av1_find_mv_refs((AV1_COMMON *)&x_02->as_mv,(MACROBLOCKD *)x_01,(MB_MODE_INFO *)cm_00,
                               (MV_REFERENCE_FRAME)((ulong)xd_00 >> 0x38),
                               (uint8_t *)CONCAT44(above_stride,iVar3),
                               (CANDIDATE_MV (*) [8])
                               CONCAT44(iVar15,CONCAT13(bVar14,CONCAT12(in_stack_ffffffffffffff9a,
                                                                        in_stack_ffffffffffffff98)))
                               ,(uint16_t (*) [8])ref_mv_weight,in_RSI,in_RDI,unaff_RBX);
              av1_copy_usable_ref_mv_stack_and_weight
                        ((MACROBLOCKD *)x_01,(MB_MODE_INFO_EXT *)xd_00,in_stack_ffffffffffffff9a);
            }
            in_stack_ffffffffffffff9a = in_stack_ffffffffffffff9a + 1;
          }
        }
      }
      av1_count_overlappable_neighbors(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      bVar2 = get_frame_update_type
                        ((GF_GROUP *)(*(long *)in_RDI + 400),(uint)*(byte *)(in_RDI + 0x1c4b0));
      if (((((*(byte *)((long)in_RDI + 0x426e6) & 1) != 0) &&
           ((int)in_RDI[99000].as_int <=
            *(int *)(*(long *)in_RDI + 0x12448 + (ulong)bVar2 * 0x58 + (ulong)in_CL * 4))) &&
          (iVar3 = check_num_overlappable_neighbors((MB_MODE_INFO *)cm_00), iVar3 != 0)) &&
         (iVar3 = is_motion_variation_allowed_bsize(in_CL), iVar3 != 0)) {
        uVar9 = 0x40;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0x40;
        uVar13 = 0x40;
        tmp_buf = (uint8_t **)0x4000000040;
        uVar8 = 0x40;
        iVar5 = 0x80;
        uVar6 = 0x80;
        uVar7 = 0x80;
        av1_build_prediction_by_above_preds
                  ((AV1_COMMON *)0x4000000040,(MACROBLOCKD *)0x4000000040,(uint8_t **)0x4000000040,
                   (int *)0x8000000080,(int *)CONCAT44(0x80,in_stack_ffffffffffffff50),
                   (int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        av1_build_prediction_by_left_preds
                  ((AV1_COMMON *)CONCAT44(uVar13,uVar12),
                   (MACROBLOCKD *)CONCAT17(uVar11,CONCAT16(uVar10,CONCAT24(uVar9,uVar8))),tmp_buf,
                   (int *)CONCAT44(uVar7,uVar6),(int *)CONCAT44(iVar5,in_stack_ffffffffffffff50),
                   (int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        bsize_00 = (BLOCK_SIZE)((ulong)tmp_buf >> 0x38);
        iVar3 = av1_num_planes((AV1_COMMON *)&x_02->as_mv);
        av1_setup_dst_planes
                  ((macroblockd_plane *)CONCAT17(uVar11,CONCAT16(uVar10,CONCAT24(uVar9,uVar8))),
                   bsize_00,(YV12_BUFFER_CONFIG *)CONCAT44(uVar7,uVar6),iVar5,iVar3,
                   in_stack_ffffffffffffff4c,iVar4);
        calc_target_weighted_pred
                  ((AV1_COMMON *)&x_02->as_mv,x_01,(MACROBLOCKD *)cm_00,(uint8_t *)xd_00,
                   above_stride,
                   (uint8_t *)
                   CONCAT44(iVar15,CONCAT13(bVar14,CONCAT12(in_stack_ffffffffffffff9a,
                                                            in_stack_ffffffffffffff98))),(int)in_R8)
        ;
      }
      init_mode_skip_mask(in_R8,(AV1_COMP *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                          (MACROBLOCK *)&x_02->as_mv,(BLOCK_SIZE)((ulong)x_01 >> 0x38));
      set_mode_eval_params(in_RDX,x_00,mode_eval_type);
      in_RSI[0x3dca][0].as_int = 0;
      for (iVar3 = 0; iVar3 < 8; iVar3 = iVar3 + 1) {
        piVar1 = (ref_mv_weight->enc_quant_dequant_params).quants.y_quant_shift[0x51] +
                 (long)iVar3 * 2 + 6;
        piVar1[0] = -1;
        piVar1[1] = 0x7fff;
      }
      return;
    }
    in_RSI[0x2bae][(char)bVar14].as_int = 0x7fffffff;
    *(undefined2 *)((long)xd_00->plane[0].seg_iqmatrix[6] + (long)(char)bVar14 * 2 + 0x78) = 0;
    *(undefined1 *)((long)xd_00->plane[0].seg_iqmatrix[6] + (long)(char)bVar14 + 0x38) = 0xff;
    if ((in_RDI[0x1822e].as_int & (uint)""[(char)bVar14]) == 0) {
LAB_002e5373:
      if (((in_RDI[0x182a6].as_int != 0) || (in_RDI[0x182a7].as_int != 0)) ||
         (in_RDI[0x1835e].as_int != 0)) {
        if ((int)in_RDI[(long)((char)bVar14 + -1) + 0x274c2].as_int < 0) {
          if ((int)in_RSI[0x2bb2][0].as_int < (int)in_RSI[0x2bae][(char)bVar14].as_int) {
            in_stack_ffffffffffffff34 = in_RSI[0x2bb2][0].as_int;
          }
          else {
            in_stack_ffffffffffffff34 = in_RSI[0x2bae][(char)bVar14].as_int;
          }
          in_RSI[0x2bb2][0].as_int = in_stack_ffffffffffffff34;
        }
        else {
          if ((int)in_RSI[0x2bb2][1].as_int < (int)in_RSI[0x2bae][(char)bVar14].as_int) {
            local_d0 = in_RSI[0x2bb2][1];
          }
          else {
            local_d0 = in_RSI[0x2bae][(char)bVar14];
          }
          in_RSI[0x2bb2][1] = local_d0;
        }
      }
    }
    else if ((((in_R9D & 1 << (bVar14 & 0x1f)) == 0) ||
             (iVar4 = is_ref_frame_used_by_compound_ref((int)(char)bVar14,in_R9D), iVar4 != 0)) ||
            (iVar4 = is_ref_frame_used_in_cache
                               ((MV_REFERENCE_FRAME)((ulong)in_stack_ffffffffffffff10 >> 0x18),
                                (MB_MODE_INFO *)in_stack_ffffffffffffff08), iVar4 != 0)) {
      setup_buffer_ref_mvs_inter
                (in_stack_ffffffffffffff78,
                 (MACROBLOCK *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6f,in_stack_ffffffffffffff6e,in_stack_ffffffffffffff60);
      goto LAB_002e5373;
    }
    bVar14 = bVar14 + 1;
  } while( true );
}

Assistant:

static inline void set_params_rd_pick_inter_mode(
    const AV1_COMP *cpi, MACROBLOCK *x, HandleInterModeArgs *args,
    BLOCK_SIZE bsize, mode_skip_mask_t *mode_skip_mask, int skip_ref_frame_mask,
    unsigned int *ref_costs_single, unsigned int (*ref_costs_comp)[REF_FRAMES],
    struct buf_2d (*yv12_mb)[MAX_MB_PLANE]) {
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
  unsigned char segment_id = mbmi->segment_id;

  init_neighbor_pred_buf(&x->obmc_buffer, args, is_cur_buf_hbd(&x->e_mbd));
  av1_collect_neighbors_ref_counts(xd);
  estimate_ref_frame_costs(cm, xd, &x->mode_costs, segment_id, ref_costs_single,
                           ref_costs_comp);

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  x->best_pred_mv_sad[0] = INT_MAX;
  x->best_pred_mv_sad[1] = INT_MAX;

  for (MV_REFERENCE_FRAME ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME;
       ++ref_frame) {
    x->pred_mv_sad[ref_frame] = INT_MAX;
    mbmi_ext->mode_context[ref_frame] = 0;
    mbmi_ext->ref_mv_count[ref_frame] = UINT8_MAX;
    if (cpi->ref_frame_flags & av1_ref_frame_flag_list[ref_frame]) {
      // Skip the ref frame if the mask says skip and the ref is not used by
      // compound ref.
      if (skip_ref_frame_mask & (1 << ref_frame) &&
          !is_ref_frame_used_by_compound_ref(ref_frame, skip_ref_frame_mask) &&
          !is_ref_frame_used_in_cache(ref_frame, x->mb_mode_cache)) {
        continue;
      }
      assert(get_ref_frame_yv12_buf(cm, ref_frame) != NULL);
      setup_buffer_ref_mvs_inter(cpi, x, ref_frame, bsize, yv12_mb);
    }
    if (cpi->sf.inter_sf.alt_ref_search_fp ||
        cpi->sf.inter_sf.prune_single_ref ||
        cpi->sf.rt_sf.prune_inter_modes_wrt_gf_arf_based_on_sad) {
      // Store the best pred_mv_sad across all past frames
      if (cpi->ref_frame_dist_info.ref_relative_dist[ref_frame - LAST_FRAME] <
          0)
        x->best_pred_mv_sad[0] =
            AOMMIN(x->best_pred_mv_sad[0], x->pred_mv_sad[ref_frame]);
      else
        // Store the best pred_mv_sad across all future frames
        x->best_pred_mv_sad[1] =
            AOMMIN(x->best_pred_mv_sad[1], x->pred_mv_sad[ref_frame]);
    }
  }

  if (!cpi->sf.rt_sf.use_real_time_ref_set && is_comp_ref_allowed(bsize)) {
    // No second reference on RT ref set, so no need to initialize
    for (MV_REFERENCE_FRAME ref_frame = EXTREF_FRAME;
         ref_frame < MODE_CTX_REF_FRAMES; ++ref_frame) {
      mbmi_ext->mode_context[ref_frame] = 0;
      mbmi_ext->ref_mv_count[ref_frame] = UINT8_MAX;
      const MV_REFERENCE_FRAME *rf = ref_frame_map[ref_frame - REF_FRAMES];
      if (!((cpi->ref_frame_flags & av1_ref_frame_flag_list[rf[0]]) &&
            (cpi->ref_frame_flags & av1_ref_frame_flag_list[rf[1]]))) {
        continue;
      }

      if (skip_ref_frame_mask & (1 << ref_frame) &&
          !is_ref_frame_used_in_cache(ref_frame, x->mb_mode_cache)) {
        continue;
      }
      // Ref mv list population is not required, when compound references are
      // pruned.
      if (prune_ref_frame(cpi, x, ref_frame)) continue;

      av1_find_mv_refs(cm, xd, mbmi, ref_frame, mbmi_ext->ref_mv_count,
                       xd->ref_mv_stack, xd->weight, NULL, mbmi_ext->global_mvs,
                       mbmi_ext->mode_context);
      // TODO(Ravi): Populate mbmi_ext->ref_mv_stack[ref_frame][4] and
      // mbmi_ext->weight[ref_frame][4] inside av1_find_mv_refs.
      av1_copy_usable_ref_mv_stack_and_weight(xd, mbmi_ext, ref_frame);
    }
  }

  av1_count_overlappable_neighbors(cm, xd);
  const FRAME_UPDATE_TYPE update_type =
      get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);
  int use_actual_frame_probs = 1;
  int prune_obmc;
#if CONFIG_FPMT_TEST
  use_actual_frame_probs =
      (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) ? 0 : 1;
  if (!use_actual_frame_probs) {
    prune_obmc = cpi->ppi->temp_frame_probs.obmc_probs[update_type][bsize] <
                 cpi->sf.inter_sf.prune_obmc_prob_thresh;
  }
#endif
  if (use_actual_frame_probs) {
    prune_obmc = cpi->ppi->frame_probs.obmc_probs[update_type][bsize] <
                 cpi->sf.inter_sf.prune_obmc_prob_thresh;
  }
  if (cpi->oxcf.motion_mode_cfg.enable_obmc && !prune_obmc) {
    if (check_num_overlappable_neighbors(mbmi) &&
        is_motion_variation_allowed_bsize(bsize)) {
      int dst_width1[MAX_MB_PLANE] = { MAX_SB_SIZE, MAX_SB_SIZE, MAX_SB_SIZE };
      int dst_width2[MAX_MB_PLANE] = { MAX_SB_SIZE >> 1, MAX_SB_SIZE >> 1,
                                       MAX_SB_SIZE >> 1 };
      int dst_height1[MAX_MB_PLANE] = { MAX_SB_SIZE >> 1, MAX_SB_SIZE >> 1,
                                        MAX_SB_SIZE >> 1 };
      int dst_height2[MAX_MB_PLANE] = { MAX_SB_SIZE, MAX_SB_SIZE, MAX_SB_SIZE };
      av1_build_prediction_by_above_preds(cm, xd, args->above_pred_buf,
                                          dst_width1, dst_height1,
                                          args->above_pred_stride);
      av1_build_prediction_by_left_preds(cm, xd, args->left_pred_buf,
                                         dst_width2, dst_height2,
                                         args->left_pred_stride);
      const int num_planes = av1_num_planes(cm);
      av1_setup_dst_planes(xd->plane, bsize, &cm->cur_frame->buf, mi_row,
                           mi_col, 0, num_planes);
      calc_target_weighted_pred(
          cm, x, xd, args->above_pred_buf[0], args->above_pred_stride[0],
          args->left_pred_buf[0], args->left_pred_stride[0]);
    }
  }

  init_mode_skip_mask(mode_skip_mask, cpi, x, bsize);

  // Set params for mode evaluation
  set_mode_eval_params(cpi, x, MODE_EVAL);

  x->comp_rd_stats_idx = 0;

  for (int idx = 0; idx < REF_FRAMES; idx++) {
    args->best_single_sse_in_refs[idx] = INT32_MAX;
  }
}